

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O3

void visitor_suite::test_void_with_int(void)

{
  storage_type data;
  int local_1c;
  small_union<std::allocator<char>,int,unsigned_long,bool,int> local_18 [8];
  undefined8 local_10;
  
  local_10 = 0;
  local_18[0] = (small_union<std::allocator<char>,int,unsigned_long,bool,int>)0x1;
  local_1c = 0x2a;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::visitor_void_with_int,void,int>(local_18,&local_1c);
  local_1c = 0x2a;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void_with_int,void,int>(local_18,&local_1c);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::destructor,void>
            (local_18);
  return;
}

Assistant:

void test_void_with_int()
{
    storage_type data{true};
    data.call<visitor_void_with_int, void>(42);
    data.call<const_visitor_void_with_int, void>(42);
}